

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

void __thiscall ON_Outline::SortFigures(ON_Outline *this,Orientation outer_loop_orientation)

{
  ON_OutlineFigure *pOVar1;
  Orientation OVar2;
  Type TVar3;
  Orientation OVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ON_OutlineFigure **ppOVar10;
  ON_OutlineFigure *pOVar11;
  int local_174;
  undefined1 local_170 [4];
  int i_2;
  ON_ClassArray<ON_OutlineFigure> tmp;
  ON_OutlineFigure *pOStack_150;
  int k_2;
  ON_OutlineFigure *f_1;
  ON_OutlineFigure *pOStack_140;
  uint k_1;
  ON_OutlineFigure *inner_figure;
  ON_OutlineFigure *pOStack_130;
  uint j;
  ON_OutlineFigure *outer_figure;
  uint i_1;
  uint local_11c;
  uint inner_count;
  uint outer_count;
  ON_OutlineFigure *bigger_f;
  ON_OutlineFigure *pOStack_108;
  uint k0;
  ON_OutlineFigure *parent_outer_figure;
  ON_OutlineFigure *f;
  undefined1 local_f0 [4];
  uint k;
  ON_SimpleArray<ON_OutlineFigure_*> inner_figures_parent;
  ON_SimpleArray<ON_OutlineFigure_*> inner_figures;
  ON_SimpleArray<ON_OutlineFigure_*> outer_figures;
  uint sorted_figure_count;
  Orientation figure_orientation;
  ON_BoundingBox figure_bbox;
  double figure_area;
  ON_OutlineFigure *ptr;
  int i;
  undefined1 local_50 [8];
  ON_SimpleArray<ON_OutlineFigure_*> ignored_figures;
  ON_SimpleArray<ON_OutlineFigure_*> sorted_figures;
  Orientation inner_loop_orientation;
  int figure_count;
  Orientation outer_loop_orientation_local;
  ON_Outline *this_local;
  
  if ((((outer_loop_orientation == Clockwise) || (outer_loop_orientation == CounterClockwise)) &&
      (outer_loop_orientation != this->m_sorted_figure_outer_orientation)) &&
     (this->m_sorted_figure_outer_orientation != Error)) {
    this->m_sorted_figure_outer_orientation = outer_loop_orientation;
    iVar6 = ON_ClassArray<ON_OutlineFigure>::Count(&this->m_figures);
    if (0 < iVar6) {
      OVar2 = Clockwise - (outer_loop_orientation == Clockwise);
      ON_SimpleArray<ON_OutlineFigure_*>::ON_SimpleArray
                ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count,(long)iVar6);
      ON_SimpleArray<ON_OutlineFigure_*>::ON_SimpleArray
                ((ON_SimpleArray<ON_OutlineFigure_*> *)local_50,(long)iVar6);
      for (ptr._0_4_ = 0; (int)ptr < iVar6; ptr._0_4_ = (int)ptr + 1) {
        figure_area = (double)ON_ClassArray<ON_OutlineFigure>::operator[](&this->m_figures,(int)ptr)
        ;
        TVar3 = ON_OutlineFigure::FigureType((ON_OutlineFigure *)figure_area);
        if (((TVar3 == Perimeter) ||
            (TVar3 = ON_OutlineFigure::FigureType((ON_OutlineFigure *)figure_area), TVar3 == Unknown
            )) || (TVar3 = ON_OutlineFigure::FigureType((ON_OutlineFigure *)figure_area),
                  TVar3 == Unset)) {
          figure_bbox.m_max.z = ON_OutlineFigure::AreaEstimate((ON_OutlineFigure *)figure_area);
          ON_OutlineFigure::BoundingBox
                    ((ON_BoundingBox *)&sorted_figure_count,(ON_OutlineFigure *)figure_area);
          OVar4 = ON_OutlineFigure::FigureOrientation((ON_OutlineFigure *)figure_area);
          if ((((figure_bbox.m_max.z == 0.0) && (!NAN(figure_bbox.m_max.z))) ||
              ((bVar5 = ON_IsValid(figure_bbox.m_max.z), !bVar5 ||
               ((bVar5 = ON_BoundingBox::IsNotEmpty((ON_BoundingBox *)&sorted_figure_count), !bVar5
                || (bVar5 = ON_BoundingBox::IsPoint((ON_BoundingBox *)&sorted_figure_count), bVar5))
               )))) || ((outer_loop_orientation != OVar4 && (OVar2 != OVar4)))) {
            *(undefined1 *)((long)figure_area + 5) = 5;
            goto LAB_00647925;
          }
          ON_SimpleArray<ON_OutlineFigure_*>::Append
                    ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count,
                     (ON_OutlineFigure **)&figure_area);
        }
        else {
LAB_00647925:
          ON_SimpleArray<ON_OutlineFigure_*>::Append
                    ((ON_SimpleArray<ON_OutlineFigure_*> *)local_50,
                     (ON_OutlineFigure **)&figure_area);
        }
      }
      uVar7 = ON_SimpleArray<ON_OutlineFigure_*>::UnsignedCount
                        ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count);
      ON_SimpleArray<ON_OutlineFigure_*>::QuickSort
                ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count,
                 Internal_CompareAreaEstimate);
      ON_SimpleArray<ON_OutlineFigure_*>::ON_SimpleArray
                ((ON_SimpleArray<ON_OutlineFigure_*> *)&inner_figures.m_count,(ulong)uVar7);
      ON_SimpleArray<ON_OutlineFigure_*>::ON_SimpleArray
                ((ON_SimpleArray<ON_OutlineFigure_*> *)&inner_figures_parent.m_count,(ulong)uVar7);
      ON_SimpleArray<ON_OutlineFigure_*>::ON_SimpleArray
                ((ON_SimpleArray<ON_OutlineFigure_*> *)local_f0,(ulong)uVar7);
      for (f._4_4_ = 0; f._4_4_ < uVar7; f._4_4_ = f._4_4_ + 1) {
        ppOVar10 = ON_SimpleArray<ON_OutlineFigure_*>::operator[]
                             ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count,f._4_4_
                             );
        parent_outer_figure = *ppOVar10;
        pOStack_108 = (ON_OutlineFigure *)0x0;
        for (bigger_f._4_4_ = 0; bigger_f._4_4_ < f._4_4_; bigger_f._4_4_ = bigger_f._4_4_ + 1) {
          ppOVar10 = ON_SimpleArray<ON_OutlineFigure_*>::operator[]
                               ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count,
                                bigger_f._4_4_);
          _inner_count = *ppOVar10;
          bVar5 = ON_OutlineFigure::IsInsideOf(parent_outer_figure,_inner_count,false);
          if (bVar5) {
            OVar4 = ON_OutlineFigure::FigureOrientation(_inner_count);
            if (outer_loop_orientation == OVar4) {
              pOStack_108 = _inner_count;
            }
            else {
              OVar4 = ON_OutlineFigure::FigureOrientation(_inner_count);
              if (OVar2 == OVar4) {
                pOStack_108 = (ON_OutlineFigure *)0x0;
              }
            }
          }
        }
        if (pOStack_108 == (ON_OutlineFigure *)0x0) {
          ON_SimpleArray<ON_OutlineFigure_*>::Append
                    ((ON_SimpleArray<ON_OutlineFigure_*> *)&inner_figures.m_count,
                     &parent_outer_figure);
          OVar4 = ON_OutlineFigure::FigureOrientation(parent_outer_figure);
          if (OVar2 == OVar4) {
            ON_OutlineFigure::ReverseFigure(parent_outer_figure);
          }
        }
        else {
          ON_SimpleArray<ON_OutlineFigure_*>::Append
                    ((ON_SimpleArray<ON_OutlineFigure_*> *)&inner_figures_parent.m_count,
                     &parent_outer_figure);
          ON_SimpleArray<ON_OutlineFigure_*>::Append
                    ((ON_SimpleArray<ON_OutlineFigure_*> *)local_f0,&stack0xfffffffffffffef8);
          OVar4 = ON_OutlineFigure::FigureOrientation(parent_outer_figure);
          if (outer_loop_orientation == OVar4) {
            ON_OutlineFigure::ReverseFigure(parent_outer_figure);
          }
        }
      }
      local_11c = ON_SimpleArray<ON_OutlineFigure_*>::UnsignedCount
                            ((ON_SimpleArray<ON_OutlineFigure_*> *)&inner_figures.m_count);
      i_1 = ON_SimpleArray<ON_OutlineFigure_*>::UnsignedCount
                      ((ON_SimpleArray<ON_OutlineFigure_*> *)&inner_figures_parent.m_count);
      if (local_11c == 0) {
        this->m_sorted_figure_outer_orientation = Error;
      }
      else if (i_1 != 0) {
        ON_SimpleArray<ON_OutlineFigure_*>::SetCount
                  ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count,0);
        for (outer_figure._0_4_ = 0; (uint)outer_figure < local_11c;
            outer_figure._0_4_ = (uint)outer_figure + 1) {
          ppOVar10 = ON_SimpleArray<ON_OutlineFigure_*>::operator[]
                               ((ON_SimpleArray<ON_OutlineFigure_*> *)&inner_figures.m_count,
                                (uint)outer_figure);
          pOStack_130 = *ppOVar10;
          if (pOStack_130 != (ON_OutlineFigure *)0x0) {
            ON_SimpleArray<ON_OutlineFigure_*>::Append
                      ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count,
                       &stack0xfffffffffffffed0);
            for (inner_figure._4_4_ = 0; pOVar1 = pOStack_130, inner_figure._4_4_ < i_1;
                inner_figure._4_4_ = inner_figure._4_4_ + 1) {
              ppOVar10 = ON_SimpleArray<ON_OutlineFigure_*>::operator[]
                                   ((ON_SimpleArray<ON_OutlineFigure_*> *)local_f0,
                                    inner_figure._4_4_);
              if (pOVar1 == *ppOVar10) {
                ppOVar10 = ON_SimpleArray<ON_OutlineFigure_*>::operator[]
                                     ((ON_SimpleArray<ON_OutlineFigure_*> *)
                                      &inner_figures_parent.m_count,inner_figure._4_4_);
                pOStack_140 = *ppOVar10;
                ppOVar10 = ON_SimpleArray<ON_OutlineFigure_*>::operator[]
                                     ((ON_SimpleArray<ON_OutlineFigure_*> *)
                                      &inner_figures_parent.m_count,inner_figure._4_4_);
                *ppOVar10 = (ON_OutlineFigure *)0x0;
                ppOVar10 = ON_SimpleArray<ON_OutlineFigure_*>::operator[]
                                     ((ON_SimpleArray<ON_OutlineFigure_*> *)local_f0,
                                      inner_figure._4_4_);
                *ppOVar10 = (ON_OutlineFigure *)0x0;
                if (pOStack_140 != (ON_OutlineFigure *)0x0) {
                  ON_SimpleArray<ON_OutlineFigure_*>::Append
                            ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count,
                             &stack0xfffffffffffffec0);
                }
              }
            }
          }
        }
        for (f_1._4_4_ = 0; uVar7 = f_1._4_4_,
            uVar8 = ON_SimpleArray<ON_OutlineFigure_*>::UnsignedCount
                              ((ON_SimpleArray<ON_OutlineFigure_*> *)local_50), uVar7 < uVar8;
            f_1._4_4_ = f_1._4_4_ + 1) {
          ppOVar10 = ON_SimpleArray<ON_OutlineFigure_*>::operator[]
                               ((ON_SimpleArray<ON_OutlineFigure_*> *)local_50,f_1._4_4_);
          pOStack_150 = *ppOVar10;
          if (pOStack_150 != (ON_OutlineFigure *)0x0) {
            ON_SimpleArray<ON_OutlineFigure_*>::Append
                      ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count,
                       &stack0xfffffffffffffeb0);
          }
        }
        iVar9 = ON_SimpleArray<ON_OutlineFigure_*>::Count
                          ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count);
        if (iVar9 == iVar6) {
          tmp.m_capacity = 0;
LAB_00647ef5:
          if (tmp.m_capacity < iVar6) {
            ppOVar10 = ON_SimpleArray<ON_OutlineFigure_*>::operator[]
                                 ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count,
                                  tmp.m_capacity);
            pOVar1 = *ppOVar10;
            pOVar11 = ON_ClassArray<ON_OutlineFigure>::operator[](&this->m_figures,tmp.m_capacity);
            if (pOVar1 == pOVar11) goto LAB_0064801d;
            ON_ClassArray<ON_OutlineFigure>::ON_ClassArray
                      ((ON_ClassArray<ON_OutlineFigure> *)local_170,(long)iVar6);
            for (local_174 = 0; local_174 < iVar6; local_174 = local_174 + 1) {
              ppOVar10 = ON_SimpleArray<ON_OutlineFigure_*>::operator[]
                                   ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count,
                                    local_174);
              ON_ClassArray<ON_OutlineFigure>::Append
                        ((ON_ClassArray<ON_OutlineFigure> *)local_170,*ppOVar10);
            }
            ON_ClassArray<ON_OutlineFigure>::operator=
                      (&this->m_figures,(ON_ClassArray<ON_OutlineFigure> *)local_170);
            outer_figure._4_4_ = 0x14;
            ON_ClassArray<ON_OutlineFigure>::~ON_ClassArray
                      ((ON_ClassArray<ON_OutlineFigure> *)local_170);
          }
        }
      }
      outer_figure._4_4_ = 1;
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray
                ((ON_SimpleArray<ON_OutlineFigure_*> *)local_f0);
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray
                ((ON_SimpleArray<ON_OutlineFigure_*> *)&inner_figures_parent.m_count);
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray
                ((ON_SimpleArray<ON_OutlineFigure_*> *)&inner_figures.m_count);
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray
                ((ON_SimpleArray<ON_OutlineFigure_*> *)local_50);
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray
                ((ON_SimpleArray<ON_OutlineFigure_*> *)&ignored_figures.m_count);
    }
  }
  return;
LAB_0064801d:
  tmp.m_capacity = tmp.m_capacity + 1;
  goto LAB_00647ef5;
}

Assistant:

void ON_Outline::SortFigures(
  ON_OutlineFigure::Orientation outer_loop_orientation
)
{
  if (
    ON_OutlineFigure::Orientation::Clockwise != outer_loop_orientation
    && ON_OutlineFigure::Orientation::CounterClockwise != outer_loop_orientation
    )
    return;

  if (outer_loop_orientation == m_sorted_figure_outer_orientation)
    return;

  if (ON_OutlineFigure::Orientation::Error == m_sorted_figure_outer_orientation)
    return; // not sortable

   m_sorted_figure_outer_orientation = outer_loop_orientation;

  const int figure_count = m_figures.Count();
  if (figure_count <= 0)
    return;

  const ON_OutlineFigure::Orientation inner_loop_orientation
    = (ON_OutlineFigure::Orientation::Clockwise == outer_loop_orientation)
    ? ON_OutlineFigure::Orientation::CounterClockwise
    : ON_OutlineFigure::Orientation::Clockwise;

  ON_SimpleArray<ON_OutlineFigure*> sorted_figures(figure_count);
  ON_SimpleArray<ON_OutlineFigure*> ignored_figures(figure_count);

  for (int i = 0; i < figure_count; i++)
  {
    ON_OutlineFigure* ptr = &m_figures[i];
    if (
      (ON_OutlineFigure::Type::Perimeter == ptr->FigureType()
        || ON_OutlineFigure::Type::Unknown == ptr->FigureType()
        || ON_OutlineFigure::Type::Unset == ptr->FigureType())
      )
    {
      const double figure_area = ptr->AreaEstimate();
      const ON_BoundingBox figure_bbox = ptr->BoundingBox();
      const ON_OutlineFigure::Orientation figure_orientation = ptr->FigureOrientation();

      if (
        0.0 != figure_area && ON_IsValid(figure_area)
        && figure_bbox.IsNotEmpty() && false == figure_bbox.IsPoint()
        && (outer_loop_orientation == figure_orientation
          || inner_loop_orientation == figure_orientation)
        )
      {
        sorted_figures.Append(ptr);
        continue;
      }

      // Mark this figure has NotPerimeter because something about
      // its path is not valid. This will prevent it from being 
      // used in meshing.
      ptr->m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
    }

    // ignored figures are ones that are not a perimeter of an inner
    // or outer boundary.
    ignored_figures.Append(ptr);
  }

  const unsigned int sorted_figure_count = sorted_figures.UnsignedCount();

  // Sort figures so the ones with largest included area are first.
  sorted_figures.QuickSort(Internal_CompareAreaEstimate);

  // As we look at each element of sorted_figures[], it gets assigned to
  // outer_figures[] or inner_figures[]. If it is assigned to inner_figures[],
  // the smallest figure that contains it is assigned to inner_figures_parent[].
  //
  // Over the years, many more complicated approaches to sorting were tried,
  // all of which attempted to take into account the orientations from the font file. 
  // It is so common for the orientations in the font files to be wrong, 
  // that ignoring them is the most efficient and reliable approach to date.
  // It is extremly common for outer figures to overlap.
  ON_SimpleArray<ON_OutlineFigure*> outer_figures(sorted_figure_count);
  ON_SimpleArray<ON_OutlineFigure*> inner_figures(sorted_figure_count);
  ON_SimpleArray<ON_OutlineFigure*> inner_figures_parent(sorted_figure_count);

  for (  unsigned k = 0; k < sorted_figure_count; ++k)
  {
    ON_OutlineFigure* f = sorted_figures[k];

    // This for(int k0; ...) loop finds the smallest larger figure that contains f and uses
    // the orientation of this containing loop to determine the orientation of f.
    ON_OutlineFigure* parent_outer_figure = nullptr;
    for (unsigned k0 = 0; k0 < k; ++k0)
    {
      // Given our assumptions, it is impossible for bigger_f to be inside of f.
      ON_OutlineFigure* bigger_f = sorted_figures[k0];
      if (false == f->IsInsideOf(bigger_f, false))
        continue;

      if (outer_loop_orientation == bigger_f->FigureOrientation())
      {
        // f is inside of bigger_f and bigger_f is an outer loop.
        parent_outer_figure = bigger_f;
      }
      else if (inner_loop_orientation == bigger_f->FigureOrientation())
      {
        // f is inside of bigger_f and bigger_f is an inner loop.
        // So f is a nested outer (like the registered trademark glyph)
        parent_outer_figure = nullptr;
      }
    }

    if (nullptr == parent_outer_figure)
    {
      outer_figures.Append(f);
      if (inner_loop_orientation == f->FigureOrientation())
      {
        // convert this figure to an outer.
        f->ReverseFigure();
      }
    }
    else
    {
      inner_figures.Append(f);
      inner_figures_parent.Append(parent_outer_figure);
      if (outer_loop_orientation == f->FigureOrientation())
      {
        // convert this figure to an inner
        f->ReverseFigure();
      }
    }
  }

  const unsigned outer_count = outer_figures.UnsignedCount();
  const unsigned inner_count = inner_figures.UnsignedCount();

  if ( 0 == outer_count )
  {
    m_sorted_figure_outer_orientation = ON_OutlineFigure::Orientation::Error;
    return;
  }

  if (0 == inner_count)
  {
    return;
  }

  // Sort figures by outer followed by its inners.
  sorted_figures.SetCount(0);
    for (unsigned i = 0; i < outer_count; ++i)
  {
    ON_OutlineFigure* outer_figure = outer_figures[i];
    if (nullptr == outer_figure)
      continue;
    sorted_figures.Append(outer_figure);
    for (unsigned j = 0; j < inner_count; ++j)
    {
      if (outer_figure == inner_figures_parent[j])
      {
        ON_OutlineFigure* inner_figure = inner_figures[j];
        inner_figures[j] = nullptr;
        inner_figures_parent[j] = nullptr;
        if (nullptr != inner_figure)
          sorted_figures.Append(inner_figure);
      }
    }
  }

  // Put single stroke and other non-perimeter figures on the end.
  for (unsigned int k = 0; k < ignored_figures.UnsignedCount(); k++)
  {
    ON_OutlineFigure* f = ignored_figures[k];
    if (nullptr != f)
      sorted_figures.Append(f);
  }

  if (sorted_figures.Count() == figure_count)
  {
    for (int k = 0; k < figure_count; k++)
    {
      if (sorted_figures[k] != &m_figures[k])
      {
        // Need to reorder m_figures[] array
        ON_ClassArray<ON_OutlineFigure> tmp(figure_count);
        for (int i = 0; i < figure_count; i++)
        {
          tmp.Append(*sorted_figures[i]);
        }
        m_figures = tmp;
        break;
      }
    }
  }

  return;
}